

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int *piVar6;
  pointer piVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  _func_int ***ppp_Var11;
  uint uVar12;
  int iVar13;
  float *pfVar14;
  _func_int ***ppp_Var15;
  uint uVar16;
  void *pvVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  undefined1 (*pauVar23) [32];
  ulong uVar24;
  int iVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar32 [64];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  allocator_type local_1d1;
  Mat *local_1d0;
  Mat local_1c8;
  ulong local_180;
  undefined8 local_178;
  ulong local_170;
  Mat local_168;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  long local_e8;
  Allocator *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  _func_int ***local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar2 = local_b8;
  auVar29 = in_ZMM2._0_16_;
  local_118 = (ulong)(uint)bottom_top_blob->w;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = bottom_top_blob->h;
  uVar22 = bottom_top_blob->c;
  uVar24 = (ulong)uVar22;
  _elemsize = bottom_top_blob->elemsize;
  local_168.cstep = 0;
  local_168.data = (Allocator *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_168.elempack = 0;
  local_b8._8_24_ = auVar2._8_24_;
  local_168.allocator = (Allocator *)local_168.data;
  local_168.dims = (int)local_168.refcount;
  local_168.w = local_168.refcount._4_4_;
  local_168._48_8_ = local_168.elemsize;
  local_168.c = local_168.elempack;
  Mat::create(&local_168,bottom_top_blob->w,bottom_top_blob->h,uVar22,_elemsize,
              opt->workspace_allocator);
  iVar18 = -100;
  if (((Allocator *)local_168.data == (Allocator *)0x0) ||
     ((long)local_168.c * local_168.cstep == 0)) goto LAB_0031362c;
  uVar16 = local_b8._0_4_ * (int)local_118;
  if (0 < (int)uVar22) {
    uVar10 = 0;
    do {
      pfVar14 = (float *)(bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var11 = (_func_int ***)
                  ((long)(_func_int ***)local_168.data +
                  local_168.cstep * uVar10 * local_168.elemsize);
      if ((int)uVar16 < 8) {
        uVar12 = 0;
      }
      else {
        iVar18 = 7;
        do {
          auVar2._4_4_ = pfVar14[1] * pfVar14[1];
          auVar2._0_4_ = *pfVar14 * *pfVar14;
          auVar2._8_4_ = pfVar14[2] * pfVar14[2];
          auVar2._12_4_ = pfVar14[3] * pfVar14[3];
          auVar2._16_4_ = pfVar14[4] * pfVar14[4];
          auVar2._20_4_ = pfVar14[5] * pfVar14[5];
          auVar2._24_4_ = pfVar14[6] * pfVar14[6];
          auVar2._28_4_ = pfVar14[7];
          *(undefined1 (*) [32])ppp_Var11 = auVar2;
          pfVar14 = pfVar14 + 8;
          ppp_Var11 = ppp_Var11 + 4;
          iVar18 = iVar18 + 8;
          uVar12 = uVar16 & 0xfffffff8;
        } while (iVar18 < (int)uVar16);
      }
      if (uVar16 - uVar12 != 0 && (int)uVar12 <= (int)uVar16) {
        lVar21 = 0;
        do {
          *(float *)((long)ppp_Var11 + lVar21 * 4) = pfVar14[lVar21] * pfVar14[lVar21];
          lVar21 = lVar21 + 1;
        } while (uVar16 - uVar12 != (int)lVar21);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar24);
  }
  iVar18 = (this->super_LRN).region_type;
  local_170 = uVar24;
  if (iVar18 == 0) {
    local_1c8.cstep = 0;
    local_1c8.data = (Allocator *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    auVar32 = ZEXT1664(auVar29);
    Mat::create(&local_1c8,(int)local_118,local_b8._0_4_,uVar22,_elemsize,opt->workspace_allocator);
    if (((Allocator *)local_1c8.data == (Allocator *)0x0) ||
       (local_1c8.cstep * (long)local_1c8.c == 0)) {
      piVar6 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
joined_r0x00313604:
            if ((Allocator *)local_1c8.data != (Allocator *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00313627:
      iVar18 = -100;
      goto LAB_0031362c;
    }
    uVar12 = (int)local_1c8.cstep * local_1c8.c;
    if (0 < (int)uVar12) {
      memset(local_1c8.data,0,(ulong)uVar12 << 2);
    }
    if (0 < (int)uVar22) {
      local_f8._0_4_ = (this->super_LRN).alpha / (float)(this->super_LRN).local_size;
      local_f8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar29 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar29;
      local_b8._0_16_ = auVar29;
      uVar10 = 0;
      local_178 = CONCAT44(local_178._4_4_,uVar16) & 0xfffffffffffffff8;
      uVar22 = uVar16 & 0xfffffff8;
      local_1d0 = bottom_top_blob;
      do {
        auVar52._8_4_ = 0x3f3504f3;
        auVar52._0_8_ = 0x3f3504f33f3504f3;
        auVar49._8_4_ = 0x3f000000;
        auVar49._0_8_ = 0x3f0000003f000000;
        auVar47._8_4_ = 0x807fffff;
        auVar47._0_8_ = 0x807fffff807fffff;
        auVar44._8_4_ = 0x800000;
        auVar44._0_8_ = 0x80000000800000;
        auVar52._12_4_ = 0x3f3504f3;
        auVar49._12_4_ = 0x3f000000;
        auVar47._12_4_ = 0x807fffff;
        auVar44._12_4_ = 0x800000;
        auVar52._16_4_ = 0x3f3504f3;
        auVar49._16_4_ = 0x3f000000;
        auVar47._16_4_ = 0x807fffff;
        auVar44._16_4_ = 0x800000;
        auVar52._20_4_ = 0x3f3504f3;
        auVar49._20_4_ = 0x3f000000;
        auVar47._20_4_ = 0x807fffff;
        auVar44._20_4_ = 0x800000;
        auVar52._24_4_ = 0x3f3504f3;
        auVar49._24_4_ = 0x3f000000;
        auVar47._24_4_ = 0x807fffff;
        auVar44._24_4_ = 0x800000;
        auVar52._28_4_ = 0x3f3504f3;
        auVar49._28_4_ = 0x3f000000;
        auVar47._28_4_ = 0x807fffff;
        auVar44._28_4_ = 0x800000;
        iVar18 = (this->super_LRN).local_size / 2;
        iVar25 = (int)uVar10;
        uVar12 = iVar25 - iVar18;
        if ((int)uVar12 <= iVar18 + iVar25) {
          do {
            if (uVar12 < (uint)uVar24) {
              ppp_Var11 = (_func_int ***)
                          ((long)(_func_int ***)local_168.data +
                          uVar12 * local_168.cstep * local_168.elemsize);
              ppp_Var15 = (_func_int ***)
                          ((long)(_func_int ***)local_1c8.data +
                          local_1c8.cstep * uVar10 *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
              uVar19 = 0;
              if (7 < (int)uVar16) {
                iVar18 = 7;
                do {
                  auVar27._0_4_ = *(float *)ppp_Var15 + *(float *)ppp_Var11;
                  auVar27._4_4_ = *(float *)((long)ppp_Var15 + 4) + *(float *)((long)ppp_Var11 + 4);
                  auVar27._8_4_ = *(float *)(ppp_Var15 + 1) + *(float *)(ppp_Var11 + 1);
                  auVar27._12_4_ =
                       *(float *)((long)(ppp_Var15 + 1) + 4) + *(float *)((long)(ppp_Var11 + 1) + 4)
                  ;
                  auVar27._16_4_ = *(float *)(ppp_Var15 + 2) + *(float *)(ppp_Var11 + 2);
                  auVar27._20_4_ =
                       *(float *)((long)(ppp_Var15 + 2) + 4) + *(float *)((long)(ppp_Var11 + 2) + 4)
                  ;
                  auVar27._24_4_ = *(float *)(ppp_Var15 + 3) + *(float *)(ppp_Var11 + 3);
                  auVar27._28_4_ =
                       *(float *)((long)(ppp_Var15 + 3) + 4) + *(float *)((long)(ppp_Var11 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var15 = auVar27;
                  ppp_Var11 = ppp_Var11 + 4;
                  ppp_Var15 = ppp_Var15 + 4;
                  iVar18 = iVar18 + 8;
                  uVar19 = uVar22;
                } while (iVar18 < (int)uVar16);
              }
              if (uVar16 - uVar19 != 0 && (int)uVar19 <= (int)uVar16) {
                lVar21 = 0;
                do {
                  *(float *)((long)ppp_Var15 + lVar21 * 4) =
                       *(float *)((long)ppp_Var15 + lVar21 * 4) +
                       *(float *)((long)ppp_Var11 + lVar21 * 4);
                  lVar21 = lVar21 + 1;
                } while (uVar16 - uVar19 != (int)lVar21);
              }
            }
            bVar1 = (int)uVar12 < (this->super_LRN).local_size / 2 + iVar25;
            uVar12 = uVar12 + 1;
          } while (bVar1);
        }
        pauVar23 = (undefined1 (*) [32])
                   (local_1d0->cstep * uVar10 * local_1d0->elemsize + (long)local_1d0->data);
        ppp_Var11 = (_func_int ***)
                    ((long)(_func_int ***)local_1c8.data +
                    local_1c8.cstep * uVar10 *
                    CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
        uVar12 = 0;
        if (7 < (int)uVar16) {
          fStack_110 = (this->super_LRN).bias;
          local_118 = CONCAT44(fStack_110,fStack_110);
          fVar26 = (this->super_LRN).beta;
          auVar29._0_8_ = CONCAT44(fVar26,fVar26) ^ 0x8000000080000000;
          auVar29._8_4_ = -fVar26;
          auVar29._12_4_ = -fVar26;
          auVar28._16_16_ = auVar29;
          auVar28._0_16_ = auVar29;
          iVar18 = 7;
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = 0x3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar30._16_4_ = 0x3f800000;
          auVar30._20_4_ = 0x3f800000;
          auVar30._24_4_ = 0x3f800000;
          auVar30._28_4_ = 0x3f800000;
          auVar50._8_4_ = 0xffffff81;
          auVar50._0_8_ = 0xffffff81ffffff81;
          auVar50._12_4_ = 0xffffff81;
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          do {
            auVar31._0_4_ = local_b8._0_4_ * *(float *)ppp_Var11 + fStack_110;
            auVar31._4_4_ = local_b8._4_4_ * *(float *)((long)ppp_Var11 + 4) + fStack_110;
            auVar31._8_4_ = local_b8._8_4_ * *(float *)(ppp_Var11 + 1) + fStack_110;
            auVar31._12_4_ = local_b8._12_4_ * *(float *)((long)(ppp_Var11 + 1) + 4) + fStack_110;
            auVar31._16_4_ = local_b8._16_4_ * *(float *)(ppp_Var11 + 2) + fStack_110;
            auVar31._20_4_ = local_b8._20_4_ * *(float *)((long)(ppp_Var11 + 2) + 4) + fStack_110;
            auVar31._24_4_ = local_b8._24_4_ * *(float *)(ppp_Var11 + 3) + fStack_110;
            auVar31._28_4_ = auVar32._28_4_ + fStack_110;
            auVar3 = vmaxps_avx(auVar31,auVar44);
            auVar2 = vandps_avx(auVar3,auVar47);
            auVar4 = vorps_avx(auVar2,auVar49);
            auVar27 = vcmpps_avx(auVar52,auVar4,2);
            auVar48 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar2 = vandnps_avx(auVar27,auVar4);
            fVar26 = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            fVar38 = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            fVar39 = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            fVar40 = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            fVar41 = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            fVar42 = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            fVar43 = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar46 = vpsubd_avx(auVar48,auVar27._16_16_);
            auVar48 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar48 = vpsubd_avx(auVar48,auVar27._0_16_);
            auVar48 = vpaddd_avx(auVar50,auVar48);
            auVar46 = vpaddd_avx(auVar50,auVar46);
            auVar45._16_16_ = auVar46;
            auVar45._0_16_ = auVar48;
            auVar3 = vcvtdq2ps_avx(auVar45);
            auVar27 = vcmpps_avx(auVar31,ZEXT432(0) << 0x20,2);
            auVar33._0_4_ =
                 auVar3._0_4_ * 0.6931472 + fVar26 +
                 fVar26 * fVar26 *
                 (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                       -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                    0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5);
            auVar33._4_4_ =
                 auVar3._4_4_ * 0.6931472 + fVar38 +
                 fVar38 * fVar38 *
                 (((((((((fVar38 * 0.070376836 + -0.1151461) * fVar38 + 0.116769984) * fVar38 +
                       -0.12420141) * fVar38 + 0.14249323) * fVar38 + -0.16668057) * fVar38 +
                    0.20000714) * fVar38 + -0.24999994) * fVar38 + 0.3333333) * fVar38 + -0.5);
            auVar33._8_4_ =
                 auVar3._8_4_ * 0.6931472 + fVar39 +
                 fVar39 * fVar39 *
                 (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                       -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 +
                    0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5);
            auVar33._12_4_ =
                 auVar3._12_4_ * 0.6931472 + fVar40 +
                 fVar40 * fVar40 *
                 (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                       -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                    0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5);
            auVar33._16_4_ =
                 auVar3._16_4_ * 0.6931472 + fVar41 +
                 fVar41 * fVar41 *
                 (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                       -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 +
                    0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5);
            auVar33._20_4_ =
                 auVar3._20_4_ * 0.6931472 + fVar42 +
                 fVar42 * fVar42 *
                 (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                       -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 +
                    0.20000714) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5);
            auVar33._24_4_ =
                 auVar3._24_4_ * 0.6931472 + fVar43 +
                 fVar43 * fVar43 *
                 (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                       -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                    0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5);
            auVar33._28_4_ = auVar3._28_4_ + auVar4._28_4_ + -1.0 + auVar2._28_4_ + -0.16666669;
            auVar2 = vorps_avx(auVar27,auVar33);
            local_98._0_4_ = (undefined4)auVar29._0_8_;
            local_98._4_4_ = (undefined4)(auVar29._0_8_ >> 0x20);
            auVar3._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar3._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar3._8_4_ = auVar2._8_4_ * auVar29._8_4_;
            auVar3._12_4_ = auVar2._12_4_ * auVar29._12_4_;
            auVar3._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar3._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar3._24_4_ = auVar2._24_4_ * auVar29._8_4_;
            auVar3._28_4_ = auVar2._28_4_;
            auVar34._8_4_ = 0x42b0c0a5;
            auVar34._0_8_ = 0x42b0c0a542b0c0a5;
            auVar34._12_4_ = 0x42b0c0a5;
            auVar34._16_4_ = 0x42b0c0a5;
            auVar34._20_4_ = 0x42b0c0a5;
            auVar34._24_4_ = 0x42b0c0a5;
            auVar34._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar3,auVar34);
            auVar35._8_4_ = 0xc2b0c0a5;
            auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar35._12_4_ = 0xc2b0c0a5;
            auVar35._16_4_ = 0xc2b0c0a5;
            auVar35._20_4_ = 0xc2b0c0a5;
            auVar35._24_4_ = 0xc2b0c0a5;
            auVar35._28_4_ = 0xc2b0c0a5;
            auVar27 = vmaxps_avx(auVar2,auVar35);
            auVar36._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
            auVar36._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
            auVar36._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
            auVar36._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
            auVar36._16_4_ = auVar27._16_4_ * 1.442695 + 0.5;
            auVar36._20_4_ = auVar27._20_4_ * 1.442695 + 0.5;
            auVar36._24_4_ = auVar27._24_4_ * 1.442695 + 0.5;
            auVar36._28_4_ = 0x3ff8aa3b;
            auVar3 = vroundps_avx(auVar36,1);
            auVar2 = vcmpps_avx(auVar36,auVar3,1);
            auVar2 = vandps_avx(auVar2,auVar30);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar4._4_4_ = auVar2._4_4_ * 0.6931472;
            auVar4._0_4_ = auVar2._0_4_ * 0.6931472;
            auVar4._8_4_ = auVar2._8_4_ * 0.6931472;
            auVar4._12_4_ = auVar2._12_4_ * 0.6931472;
            auVar4._16_4_ = auVar2._16_4_ * 0.6931472;
            auVar4._20_4_ = auVar2._20_4_ * 0.6931472;
            auVar4._24_4_ = auVar2._24_4_ * 0.6931472;
            auVar4._28_4_ = auVar3._28_4_;
            auVar27 = vsubps_avx(auVar27,auVar4);
            fVar26 = auVar27._0_4_;
            fVar38 = auVar27._4_4_;
            fVar39 = auVar27._8_4_;
            fVar40 = auVar27._12_4_;
            fVar41 = auVar27._16_4_;
            fVar42 = auVar27._20_4_;
            fVar43 = auVar27._24_4_;
            auVar48._0_4_ = (int)auVar2._0_4_;
            auVar48._4_4_ = (int)auVar2._4_4_;
            auVar48._8_4_ = (int)auVar2._8_4_;
            auVar48._12_4_ = (int)auVar2._12_4_;
            auVar37._16_4_ = (int)auVar2._16_4_;
            auVar37._0_16_ = auVar48;
            auVar37._20_4_ = (int)auVar2._20_4_;
            auVar37._24_4_ = (int)auVar2._24_4_;
            auVar37._28_4_ = (int)auVar2._28_4_;
            auVar46 = vpslld_avx(auVar48,0x17);
            auVar48 = vpslld_avx(auVar37._16_16_,0x17);
            auVar48 = vpaddd_avx(auVar51,auVar48);
            auVar46 = vpaddd_avx(auVar51,auVar46);
            auVar5._4_4_ = auVar46._4_4_ * *(float *)(*pauVar23 + 4) *
                           (fVar38 + 1.0 +
                           fVar38 * fVar38 *
                           (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) *
                              fVar38 + 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5));
            auVar5._0_4_ = auVar46._0_4_ * *(float *)*pauVar23 *
                           (fVar26 + 1.0 +
                           fVar26 * fVar26 *
                           (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) *
                              fVar26 + 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5));
            auVar5._8_4_ = auVar46._8_4_ * *(float *)(*pauVar23 + 8) *
                           (fVar39 + 1.0 +
                           fVar39 * fVar39 *
                           (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                              fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5));
            auVar5._12_4_ =
                 auVar46._12_4_ * *(float *)(*pauVar23 + 0xc) *
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5));
            auVar5._16_4_ =
                 auVar48._0_4_ * *(float *)(*pauVar23 + 0x10) *
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5));
            auVar5._20_4_ =
                 auVar48._4_4_ * *(float *)(*pauVar23 + 0x14) *
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5));
            auVar5._24_4_ =
                 auVar48._8_4_ * *(float *)(*pauVar23 + 0x18) *
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5));
            auVar5._28_4_ = auVar27._28_4_ + 1.0 + 0.71826285;
            auVar32 = ZEXT3264(auVar5);
            *pauVar23 = auVar5;
            ppp_Var11 = ppp_Var11 + 4;
            pauVar23 = pauVar23 + 1;
            iVar18 = iVar18 + 8;
            uVar12 = uVar22;
            fStack_10c = fStack_110;
            fStack_108 = fStack_110;
            fStack_104 = fStack_110;
            fStack_100 = fStack_110;
            fStack_fc = fStack_110;
            local_98 = auVar28;
          } while (iVar18 < (int)uVar16);
        }
        if (uVar16 - uVar12 != 0 && (int)uVar12 <= (int)uVar16) {
          lVar21 = 0;
          do {
            auVar32 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
            fVar26 = powf((float)local_f8._0_4_ * *(float *)((long)ppp_Var11 + lVar21 * 4) +
                          (this->super_LRN).bias,-(this->super_LRN).beta);
            *(float *)(*pauVar23 + lVar21 * 4) = fVar26 * *(float *)(*pauVar23 + lVar21 * 4);
            lVar21 = lVar21 + 1;
          } while (uVar16 - uVar12 != (int)lVar21);
        }
        uVar10 = uVar10 + 1;
        uVar24 = local_170;
        uVar22 = (uint)local_178;
      } while (uVar10 != local_170);
    }
    piVar6 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
    iVar18 = 0;
    if (piVar6 == (int *)0x0) goto LAB_0031362c;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_0031362c;
    if (local_1c8.allocator != (Allocator *)0x0) {
      (*(local_1c8.allocator)->_vptr_Allocator[3])();
      goto LAB_0031362c;
    }
  }
  else {
    if (iVar18 != 1) {
      iVar18 = 0;
      goto LAB_0031362c;
    }
    piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    local_1c8.data = local_168.data;
    local_1c8.refcount._0_4_ = (int)local_168.refcount;
    local_1c8.refcount._4_4_ = local_168.refcount._4_4_;
    local_1c8.elemsize._0_4_ = (undefined4)local_168.elemsize;
    local_1c8.elemsize._4_4_ = (undefined4)(local_168.elemsize >> 0x20);
    local_1c8.elempack = local_168.elempack;
    local_1c8.allocator = local_168.allocator;
    local_1c8.dims = local_168.dims;
    local_1c8.w = local_168.w;
    local_1c8.h = local_168.h;
    local_1c8.d = local_168.d;
    local_1c8.c = local_168.c;
    local_1c8.cstep = local_168.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    uVar16 = (this->super_LRN).local_size;
    iVar18 = (int)local_118;
    if (1 < (int)uVar16) {
      uVar12 = uVar16 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_168,&local_1c8,uVar12,~uVar12 + uVar16,uVar12,~uVar12 + uVar16,0,0.0,
                       (Option *)&_space_ofs);
      if (((Allocator *)local_1c8.data == (Allocator *)0x0) ||
         ((long)local_1c8.c * local_1c8.cstep == 0)) {
        piVar6 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) goto joined_r0x00313604;
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00313627;
      }
      uVar16 = (this->super_LRN).local_size;
      iVar18 = local_1c8.w;
    }
    uVar12 = uVar16 * uVar16;
    local_98._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar12,&local_1d1);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar25 = (this->super_LRN).local_size;
    if (0 < iVar25) {
      iVar18 = iVar18 - iVar25;
      iVar8 = 0;
      iVar9 = 0;
      iVar13 = 0;
      do {
        if (0 < iVar25) {
          lVar21 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar13 + lVar21] = iVar9 + (int)lVar21;
            iVar25 = (this->super_LRN).local_size;
            lVar21 = lVar21 + 1;
            iVar20 = (int)lVar21;
          } while (iVar20 < iVar25);
          iVar13 = iVar13 + iVar20;
          iVar9 = iVar9 + iVar20;
        }
        iVar9 = iVar9 + iVar18;
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar25);
    }
    if (0 < (int)uVar22) {
      local_178 = (ulong)(int)local_118;
      local_d0 = bottom_top_blob->data;
      local_d8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_e0 = (Allocator *)local_1c8.data;
      local_e8 = local_1c8.cstep * CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize)
      ;
      local_c8 = (long)local_1c8.w *
                 CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
      local_f8._0_4_ = 1.0 / (float)(int)uVar12;
      local_180 = 0;
      do {
        if (0 < (int)local_b8._0_4_) {
          local_c0 = (_func_int ***)((long)&local_e0->_vptr_Allocator + local_e8 * local_180);
          pvVar17 = (void *)(local_d8 * local_180 + (long)local_d0);
          local_1d0 = (Mat *)0x0;
          do {
            ppp_Var11 = local_c0;
            if (0 < (int)local_118) {
              lVar21 = local_c8 * (long)local_1d0;
              uVar24 = 0;
              do {
                if (uVar16 == 0) {
                  fVar26 = 0.0;
                }
                else {
                  fVar26 = 0.0;
                  uVar10 = 0;
                  do {
                    fVar26 = fVar26 + *(float *)((long)ppp_Var11 +
                                                (long)piVar7[uVar10] * 4 + uVar24 * 4 + lVar21);
                    uVar10 = uVar10 + 1;
                  } while (uVar12 + (uVar12 == 0) != uVar10);
                }
                fVar26 = powf(fVar26 * (float)local_98._0_4_ * (float)local_f8._0_4_ +
                              (this->super_LRN).bias,-(this->super_LRN).beta);
                *(float *)((long)pvVar17 + uVar24 * 4) =
                     fVar26 * *(float *)((long)pvVar17 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar24 != local_118);
            }
            pvVar17 = (void *)((long)pvVar17 + local_178 * 4);
            local_1d0 = (Mat *)((long)&local_1d0->data + 1);
          } while (local_1d0 != (Mat *)local_b8._0_8_);
        }
        local_180 = local_180 + 1;
      } while (local_180 != local_170);
    }
    if (piVar7 != (pointer)0x0) {
      operator_delete(piVar7,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar7);
    }
    piVar6 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
    iVar18 = 0;
    if (piVar6 == (int *)0x0) goto LAB_0031362c;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_0031362c;
    if (local_1c8.allocator != (Allocator *)0x0) {
      (*(local_1c8.allocator)->_vptr_Allocator[3])();
      goto LAB_0031362c;
    }
  }
  iVar18 = 0;
  if ((Allocator *)local_1c8.data != (Allocator *)0x0) {
    iVar18 = 0;
    free(local_1c8.data);
  }
LAB_0031362c:
  piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_168.data != (Allocator *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}